

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.hpp
# Opt level: O1

double * __thiscall openjij::graph::Sparse<double>::J(Sparse<double> *this,Index i,Index j)

{
  ulong uVar1;
  const_iterator cVar2;
  key_type local_10;
  
  uVar1 = (this->super_Graph)._num_spins;
  if (uVar1 <= i) {
    __assert_fail("i < get_num_spins()",
                  "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/include/openjij/graph/sparse.hpp"
                  ,0x120,
                  "const FloatType &openjij::graph::Sparse<double>::J(Index, Index) const [FloatType = double]"
                 );
  }
  if (uVar1 <= j) {
    __assert_fail("j < get_num_spins()",
                  "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/include/openjij/graph/sparse.hpp"
                  ,0x121,
                  "const FloatType &openjij::graph::Sparse<double>::J(Index, Index) const [FloatType = double]"
                 );
  }
  local_10.second = j;
  if (j < i) {
    local_10.second = i;
    i = j;
  }
  local_10.first = i;
  cVar2 = std::
          _Hashtable<std::pair<unsigned_long,_unsigned_long>,_std::pair<const_std::pair<unsigned_long,_unsigned_long>,_double>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_long,_unsigned_long>_>,_openjij::utility::PairHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->_J)._M_h,&local_10);
  if (cVar2.
      super__Node_iterator_base<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_double>,_true>
      ._M_cur == (__node_type *)0x0) {
    std::__throw_out_of_range("_Map_base::at");
  }
  return (double *)
         ((long)cVar2.
                super__Node_iterator_base<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_double>,_true>
                ._M_cur + 0x18);
}

Assistant:

const FloatType &J(Index i, Index j) const {
    assert(i < get_num_spins());
    assert(j < get_num_spins());
    return _J.at(std::make_pair(std::min(i, j), std::max(i, j)));
  }